

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceContextBase.hpp
# Opt level: O1

void __thiscall
Diligent::DeviceContextBase<Diligent::EngineVkImplTraits>::UnmapBuffer
          (DeviceContextBase<Diligent::EngineVkImplTraits> *this,IBuffer *pBuffer,MAP_TYPE MapType)

{
  ulong uVar1;
  int iVar2;
  undefined4 extraout_var;
  ulong uVar3;
  _Hash_node_base *in_R8;
  __node_base_ptr p_Var4;
  __node_base_ptr Args_3;
  __hash_code __code;
  _Node_iterator_base<std::pair<Diligent::IBuffer_*const,_Diligent::DeviceContextBase<Diligent::EngineVkImplTraits>::DbgMappedBufferInfo>,_false>
  __it;
  string msg;
  MAP_TYPE local_39;
  string local_38;
  
  local_39 = MapType;
  if (pBuffer == (IBuffer *)0x0) {
    FormatString<char[25]>(&local_38,(char (*) [25])0x919ca7);
    DebugAssertionFailed
              (local_38._M_dataplus._M_p,"UnmapBuffer",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceContextBase.hpp"
               ,0x720);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_38._M_dataplus._M_p != &local_38.field_2) {
      operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
    }
  }
  uVar1 = (this->m_DbgMappedBuffers)._M_h._M_bucket_count;
  uVar3 = (ulong)pBuffer % uVar1;
  p_Var4 = (this->m_DbgMappedBuffers)._M_h._M_buckets[uVar3];
  Args_3 = (__node_base_ptr)0x0;
  if ((p_Var4 != (__node_base_ptr)0x0) &&
     (in_R8 = p_Var4->_M_nxt, Args_3 = p_Var4, in_R8[1]._M_nxt != (_Hash_node_base *)pBuffer)) {
    while (p_Var4 = in_R8, in_R8 = p_Var4->_M_nxt, in_R8 != (_Hash_node_base *)0x0) {
      Args_3 = (__node_base_ptr)0x0;
      if (((ulong)in_R8[1]._M_nxt % uVar1 != uVar3) ||
         (Args_3 = p_Var4, in_R8[1]._M_nxt == (_Hash_node_base *)pBuffer)) goto LAB_002a2022;
    }
    Args_3 = (__node_base_ptr)0x0;
  }
LAB_002a2022:
  if (Args_3 == (__node_base_ptr)0x0) {
    __it._M_cur = (__node_type *)0x0;
  }
  else {
    __it._M_cur = (__node_type *)Args_3->_M_nxt;
  }
  if (__it._M_cur == (__node_type *)0x0) {
    iVar2 = (*(pBuffer->super_IDeviceObject).super_IObject._vptr_IObject[4])(pBuffer);
    FormatString<char[9],char_const*,char[23]>
              (&local_38,(Diligent *)0x8239f8,(char (*) [9])CONCAT44(extraout_var,iVar2),
               (char **)"\' has not been mapped.",(char (*) [23])in_R8);
    DebugAssertionFailed
              (local_38._M_dataplus._M_p,"UnmapBuffer",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceContextBase.hpp"
               ,0x724);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_38._M_dataplus._M_p != &local_38.field_2) {
      operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
    }
  }
  if (*(MAP_TYPE *)((long)__it._M_cur + 0x10) != local_39) {
    FormatString<char[10],Diligent::MAP_TYPE,char[63],Diligent::MAP_TYPE>
              (&local_38,(Diligent *)"MapType (",(char (*) [10])&local_39,
               (MAP_TYPE *)") does not match the map type that was used to map the buffer ",
               (char (*) [63])((long)__it._M_cur + 0x10),(MAP_TYPE *)Args_3);
    DebugAssertionFailed
              (local_38._M_dataplus._M_p,"UnmapBuffer",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceContextBase.hpp"
               ,0x725);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_38._M_dataplus._M_p != &local_38.field_2) {
      operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
    }
  }
  std::
  _Hashtable<Diligent::IBuffer_*,_std::pair<Diligent::IBuffer_*const,_Diligent::DeviceContextBase<Diligent::EngineVkImplTraits>::DbgMappedBufferInfo>,_std::allocator<std::pair<Diligent::IBuffer_*const,_Diligent::DeviceContextBase<Diligent::EngineVkImplTraits>::DbgMappedBufferInfo>_>,_std::__detail::_Select1st,_std::equal_to<Diligent::IBuffer_*>,_std::hash<Diligent::IBuffer_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::erase(&(this->m_DbgMappedBuffers)._M_h,(const_iterator)__it._M_cur);
  return;
}

Assistant:

inline void DeviceContextBase<ImplementationTraits>::UnmapBuffer(IBuffer* pBuffer, MAP_TYPE MapType)
{
    VERIFY(pBuffer, "pBuffer must not be null");
#ifdef DILIGENT_DEBUG
    {
        auto MappedBufferIt = m_DbgMappedBuffers.find(pBuffer);
        VERIFY(MappedBufferIt != m_DbgMappedBuffers.end(), "Buffer '", pBuffer->GetDesc().Name, "' has not been mapped.");
        VERIFY(MappedBufferIt->second.MapType == MapType, "MapType (", MapType, ") does not match the map type that was used to map the buffer ", MappedBufferIt->second.MapType);
        m_DbgMappedBuffers.erase(MappedBufferIt);
    }
#endif
}